

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O2

char * get_absolute_path(char *path,econf_err *error)

{
  econf_err eVar1;
  char *pcVar2;
  
  if (*path == '/') {
    pcVar2 = strdup(path);
    if (error == (econf_err *)0x0 || pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    eVar1 = ECONF_NOMEM;
  }
  else {
    pcVar2 = realpath(path,(char *)0x0);
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    if (error == (econf_err *)0x0) {
      return (char *)0x0;
    }
    eVar1 = ECONF_NOFILE;
  }
  *error = eVar1;
  return (char *)0x0;
}

Assistant:

char *get_absolute_path(const char *path, econf_err *error) {
  char *absolute_path;
  if(*path != '/') {
    absolute_path = realpath(path, NULL);
    if(absolute_path == NULL) {
      if (error)
	*error = ECONF_NOFILE;
      return NULL;
    }
  } else {
    absolute_path = strdup(path);
  }
  if (absolute_path == NULL && error)
    *error = ECONF_NOMEM;

  return absolute_path;
}